

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationManagementPduHeader.h
# Opt level: O0

void __thiscall
DIS::SimulationManagementPduHeader::SimulationManagementPduHeader
          (SimulationManagementPduHeader *this,SimulationManagementPduHeader *param_1)

{
  SimulationManagementPduHeader *param_1_local;
  SimulationManagementPduHeader *this_local;
  
  this->_vptr_SimulationManagementPduHeader =
       (_func_int **)&PTR__SimulationManagementPduHeader_00269098;
  PduHeader::PduHeader(&this->_pduHeader,&param_1->_pduHeader);
  EntityID::EntityID(&this->_originatingID,&param_1->_originatingID);
  EntityID::EntityID(&this->_recevingID,&param_1->_recevingID);
  return;
}

Assistant:

class OPENDIS7_EXPORT SimulationManagementPduHeader
{
protected:
  /** Conventional PDU header */
  PduHeader _pduHeader; 

  /** IDs the simulation or entity, etiehr a simulation or an entity. Either 6.2.80 or 6.2.28 */
  EntityID _originatingID; 

  /** simulation, all simulations, a special ID, or an entity. See 5.6.5 and 5.12.4 */
  EntityID _recevingID; 


 public:
    SimulationManagementPduHeader();
    virtual ~SimulationManagementPduHeader();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    PduHeader& getPduHeader(); 
    const PduHeader&  getPduHeader() const; 
    void setPduHeader(const PduHeader    &pX);

    EntityID& getOriginatingID(); 
    const EntityID&  getOriginatingID() const; 
    void setOriginatingID(const EntityID    &pX);

    EntityID& getRecevingID(); 
    const EntityID&  getRecevingID() const; 
    void setRecevingID(const EntityID    &pX);


virtual int getMarshalledSize() const;

     bool operator  ==(const SimulationManagementPduHeader& rhs) const;
}